

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O2

ostream * Indexing::operator<<(ostream *out,CodeTree *ct)

{
  uint depth;
  CodeOp *op;
  uint64_t uVar1;
  size_t i;
  ulong uVar2;
  CodeOp *pCVar3;
  int iVar4;
  CodeOp *op_00;
  bool bVar5;
  pair<Indexing::CodeTree::CodeOp_*,_unsigned_int> elem;
  pair<Indexing::CodeTree::CodeOp_*,_unsigned_int> elem_00;
  pair<Indexing::CodeTree::CodeOp_*,_unsigned_int> elem_01;
  pair<Indexing::CodeTree::CodeOp_*,_unsigned_int> elem_02;
  anon_class_8_1_ba1d6aae local_38;
  
  local_38.out = out;
  if (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops == '\0'
     ) {
    iVar4 = __cxa_guard_acquire(&CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                                 CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing
                                 ::CodeTree_const&)::$_0)const::top_ops);
    if (iVar4 != 0) {
      CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._16_8_
           = 0;
      CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._24_8_
           = 0;
      CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._0_8_ =
           0;
      CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._8_8_ =
           0;
      __cxa_atexit(Lib::Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_>::~Stack,
                   CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                   CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                   CodeTree_const&)::$_0)const::top_ops,&__dso_handle);
      __cxa_guard_release(&CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                           CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                           CodeTree_const&)::$_0)const::top_ops);
    }
  }
  CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0>(Indexing
  ::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._16_8_ =
       CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
       $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._8_8_;
  if (ct->_entryPoint != (CodeBlock *)0x0) {
    elem.first = ct->_entryPoint + 8;
    elem._8_8_ = 0;
    Lib::Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_>::push
              ((Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_> *)
               CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
               $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::
               top_ops,elem);
  }
  while (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
         $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
         _16_8_ != CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                   CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                   CodeTree_const&)::$_0)const::top_ops._8_8_) {
    op = *(CodeOp **)
          (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
           $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
           _16_8_ + -0x10);
    depth = *(uint *)(CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                      CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                      CodeTree_const&)::$_0)const::top_ops._16_8_ + -8);
    if ((op->_content & 7) == 6) {
      CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._16_8_
           = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
             $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
             _16_8_ + -0x10;
      operator<<::anon_class_8_1_ba1d6aae::operator()(&local_38,op,depth);
      if (op->_alternative != (CodeOp *)0x0) {
        elem_00.second = depth;
        elem_00.first = op->_alternative;
        elem_00._12_4_ = 0;
        Lib::Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_>::push
                  ((Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_> *)
                   CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                   CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                   CodeTree_const&)::$_0)const::top_ops,elem_00);
      }
      for (uVar2 = 0; uVar2 < (ulong)((long)(op[2]._content - (long)op[1]._alternative) >> 3);
          uVar2 = uVar2 + 1) {
        uVar1 = (&(op[1]._alternative)->_content)[uVar2];
        if (uVar1 != 0) {
          elem_01.second = depth + 1;
          elem_01.first = (CodeOp *)uVar1;
          elem_01._12_4_ = 0;
          Lib::Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_>::push
                    ((Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_> *)
                     CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                     CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                     CodeTree_const&)::$_0)const::top_ops,elem_01);
        }
      }
    }
    else {
      pCVar3 = op[-1]._alternative;
      iVar4 = depth - (int)pCVar3;
      op_00 = op;
      CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._16_8_
           = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
             $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
             _16_8_ + -0x10;
      while (bVar5 = pCVar3 != (CodeOp *)0x0,
            pCVar3 = (CodeOp *)((long)&pCVar3[-1]._alternative + 7), bVar5) {
        operator<<::anon_class_8_1_ba1d6aae::operator()
                  (&local_38,op_00,*(int *)&op[-1]._alternative + iVar4);
        if (op_00->_alternative != (CodeOp *)0x0) {
          elem_02.second = *(int *)&op[-1]._alternative + iVar4;
          elem_02.first = op_00->_alternative;
          elem_02._12_4_ = 0;
          Lib::Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_>::push
                    ((Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_> *)
                     CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                     CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                     CodeTree_const&)::$_0)const::top_ops,elem_02);
        }
        op_00 = op_00 + 1;
        iVar4 = iVar4 + 1;
      }
    }
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const CodeTree& ct)
{
  ct.visitAllOps([&out](const CodeTree::CodeOp* op, unsigned depth) {
    for (unsigned i = 0; i < depth; i++) {
      out << "  ";
    }
    out << *op << std::endl;
  });
  return out;
}